

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesEngineGetActivity(zes_engine_handle_t hEngine,zes_engine_stats_t *pStats)

{
  zes_pfnEngineGetActivity_t pfnGetActivity;
  ze_result_t result;
  zes_engine_stats_t *pStats_local;
  zes_engine_handle_t hEngine_local;
  
  pfnGetActivity._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cca0 != (code *)0x0) {
    pfnGetActivity._4_4_ = (*DAT_0011cca0)(hEngine,pStats);
  }
  return pfnGetActivity._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesEngineGetActivity(
        zes_engine_handle_t hEngine,                    ///< [in] Handle for the component.
        zes_engine_stats_t* pStats                      ///< [in,out] Will contain a snapshot of the engine group activity
                                                        ///< counters.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetActivity = context.zesDdiTable.Engine.pfnGetActivity;
        if( nullptr != pfnGetActivity )
        {
            result = pfnGetActivity( hEngine, pStats );
        }
        else
        {
            // generic implementation
        }

        return result;
    }